

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave-in.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  size_t argv_00;
  int argc_00;
  byte bVar2;
  char *pcVar3;
  typed_value<unsigned_long,_char> *ptVar4;
  size_type sVar5;
  ostream *poVar6;
  long *plVar7;
  undefined8 extraout_RDX;
  byte *pbVar8;
  complex<double> iq_00;
  byte local_57a;
  byte local_579;
  undefined1 auStack_578 [6];
  char qq;
  char ii;
  complex<double> iq;
  undefined1 local_548 [8];
  demod_nrz wavein;
  string local_228 [6];
  process_wavingz wave_callback;
  bool unsigned_input;
  string local_1f8 [32];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1d8;
  basic_parsed_options<char> local_1b0;
  variables_map local_188 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_178 [144];
  unsigned_long local_e8;
  undefined8 local_e0 [3];
  allocator local_c1;
  string local_c0 [32];
  options_description local_a0 [8];
  options_description desc;
  size_t local_20;
  size_t sample_rate;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  sample_rate = (size_t)argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"WavingZ - Wave-in options",&local_c1);
  boost::program_options::options_description::options_description
            (local_a0,local_c0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_e0[0] = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_e0,"help,h");
  ptVar4 = boost::program_options::value<unsigned_long>(&local_20);
  local_e8 = 2000000;
  ptVar4 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar4,&local_e8)
  ;
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"sample_rate,s",(char *)ptVar4);
  boost::program_options::options_description_easy_init::operator()(pcVar3,"unsigned,u");
  boost::program_options::variables_map::variables_map(local_188);
  argc_00 = (int)argv_local;
  argv_00 = sample_rate;
  local_1d8.super_function_base.functor._8_8_ = 0;
  local_1d8.super_function_base.functor._16_8_ = 0;
  local_1d8.super_function_base.vtable = (vtable_base *)0x0;
  local_1d8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_1d8);
  boost::program_options::parse_command_line<char>
            (&local_1b0,argc_00,(char **)argv_00,local_a0,0,&local_1d8);
  boost::program_options::store((basic_parsed_options *)&local_1b0,local_188,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1b0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1d8);
  boost::program_options::notify(local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"help",(allocator *)&unsigned_input);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_178,(key_type *)local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&unsigned_input);
  if (sVar5 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"unsigned",(allocator *)((long)&wavein.omega_c + 7));
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_178,(key_type *)local_228);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)((long)&wavein.omega_c + 7));
    std::function<void(unsigned_char*,unsigned_char*)>::function<main::process_wavingz&,void>
              ((function<void(unsigned_char*,unsigned_char*)> *)(iq._M_value + 8),
               (process_wavingz *)((long)&wavein.omega_c + 6));
    wavingz::demod::demod_nrz::demod_nrz
              ((demod_nrz *)local_548,local_20,
               (function<void_(unsigned_char_*,_unsigned_char_*)> *)(iq._M_value + 8));
    std::function<void_(unsigned_char_*,_unsigned_char_*)>::~function
              ((function<void_(unsigned_char_*,_unsigned_char_*)> *)(iq._M_value + 8));
    while( true ) {
      std::complex<double>::complex((complex<double> *)auStack_578,0.0,0.0);
      plVar7 = (long *)std::istream::get((char *)&std::cin);
      bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
      if ((bVar2 & 1) != 0) break;
      pbVar8 = &local_57a;
      plVar7 = (long *)std::istream::get((char *)&std::cin);
      bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
      if ((bVar2 & 1) != 0) break;
      if (sVar5 == 0) {
        std::complex<double>::real
                  ((complex<double> *)auStack_578,(double)(int)(char)local_579 / 127.0);
        std::complex<double>::imag
                  ((complex<double> *)auStack_578,(double)(int)(char)local_57a / 127.0);
      }
      else {
        std::complex<double>::real((complex<double> *)auStack_578,(double)local_579 / 127.0 + -1.0);
        std::complex<double>::imag((complex<double> *)auStack_578,(double)local_57a / 127.0 + -1.0);
      }
      dVar1 = std::abs<double>((complex<double> *)auStack_578);
      if (1.0 < dVar1) {
        __assert_fail("std::abs(iq) <= 1.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/wave-in.cpp"
                      ,0x5d,"int main(int, char **)");
      }
      iq_00._M_value._8_8_ = extraout_RDX;
      iq_00._M_value._0_8_ = pbVar8;
      wavingz::demod::demod_nrz::operator()((demod_nrz *)local_548,iq_00);
    }
    argv_local._4_4_ = 0;
    wavingz::demod::demod_nrz::~demod_nrz((demod_nrz *)local_548);
  }
  else {
    poVar6 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_a0);
    std::operator<<(poVar6,"\n");
    std::operator<<((ostream *)&std::cout,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"Examples:");
    std::operator<<(poVar6,"\n");
    std::operator<<((ostream *)&std::cout,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "   rtl_sdr -f 868420000 -s 2000000 -g 15 - | ./wave-in -s 2000000 -u")
    ;
    std::operator<<(poVar6,"\n");
    std::operator<<((ostream *)&std::cout,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "   hackrf_transfer -f 868420000 -s 2000000 -r data.cs8");
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"   ./wave-in -s 2000000 -u < data.cs8");
    std::operator<<(poVar6,"\n");
    std::operator<<((ostream *)&std::cout,"\n");
    argv_local._4_4_ = 1;
  }
  boost::program_options::variables_map::~variables_map(local_188);
  boost::program_options::options_description::~options_description(local_a0);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char** argv)
{
    size_t sample_rate;

    po::options_description desc("WavingZ - Wave-in options");
    desc.add_options()
        ("help,h", "Produce this help message")
        ("sample_rate,s", po::value<size_t>(&sample_rate)->default_value(2000000), "Sample rate (default 2M)")
        ("unsigned,u", "Use unsigned8 (RTL-SDR) instead of signed8 (HackRF One)")
       ;

    po::variables_map vm;
    po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);

    if (vm.count("help")) {
        cout << desc << "\n";
        cout << "\n";
        cout << "Examples:" << "\n";
        cout << "\n";
        cout << "   rtl_sdr -f 868420000 -s 2000000 -g 15 - | ./wave-in -s 2000000 -u" << "\n";
        cout << "\n";
        cout << "   hackrf_transfer -f 868420000 -s 2000000 -r data.cs8" << "\n";
        cout << "   ./wave-in -s 2000000 -u < data.cs8" << "\n";
        cout << "\n";
        return 1;
    }

    bool unsigned_input = vm.count("unsigned");

    struct process_wavingz {
        void operator()(uint8_t* begin, uint8_t*end)
        {
            wavingz::zwave_print(std::cout, begin, end) << std::endl;
        }
    } wave_callback;

    wavingz::demod::demod_nrz wavein(sample_rate, wave_callback);

    for(;;) {
        std::complex<double> iq;
        char ii, qq;
        if(!cin.get(ii) || !cin.get(qq)) break;
        if (unsigned_input)
        {
            iq.real(double((uint8_t)ii)/127.0 - 1.0);
            iq.imag(double((uint8_t)qq) / 127.0 - 1.0);
        }
        else
        {
            iq.real(double(ii)/127.0);
            iq.imag(double(qq)/127.0);
        }
        assert(std::abs(iq) <= 1.0);
        wavein(iq);
    }
    return 0;
}